

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_stats_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 (*pauVar1) [16];
  ushort *puVar2;
  short *psVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  parasail_result_t *ppVar27;
  __m128i *ptr;
  __m128i *palVar28;
  __m128i *b;
  __m128i *palVar29;
  __m128i *b_00;
  __m128i *palVar30;
  __m128i *b_01;
  __m128i *palVar31;
  __m128i *ptr_00;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  int16_t *ptr_01;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  long lVar36;
  undefined2 uVar37;
  long lVar38;
  ulong uVar39;
  __m128i *ptr_02;
  long lVar40;
  __m128i *ptr_03;
  int iVar41;
  long lVar42;
  __m128i *ptr_04;
  ulong uVar43;
  __m128i *ptr_05;
  ushort uVar44;
  undefined4 uVar46;
  undefined4 uVar47;
  ulong uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ushort uVar58;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  ushort uVar72;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  ushort uVar79;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  undefined1 auVar80 [16];
  ushort uVar88;
  undefined1 auVar81 [16];
  short sVar89;
  short sVar90;
  ushort uVar95;
  short sVar97;
  ushort uVar98;
  ushort uVar100;
  ushort uVar102;
  ushort uVar104;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  ushort uVar106;
  undefined1 auVar93 [16];
  short sVar96;
  short sVar99;
  short sVar101;
  short sVar103;
  short sVar105;
  short sVar107;
  undefined1 auVar94 [16];
  undefined1 in_XMM5 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar108 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  ulong uVar111;
  undefined1 in_XMM10 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined4 uVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  int iVar117;
  int iVar120;
  int iVar121;
  int iVar122;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  short sVar123;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  short sVar131;
  short sVar132;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  short sVar133;
  undefined1 in_XMM15 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i_16_t e;
  __m128i_16_t h;
  int local_23c;
  undefined1 local_1c8 [16];
  ushort local_1b8;
  ushort uStack_1b6;
  ushort uStack_1b4;
  ushort uStack_1b2;
  ushort uStack_1b0;
  ushort uStack_1ae;
  ushort uStack_1ac;
  ushort uStack_1aa;
  short local_138;
  short sStack_136;
  short local_128;
  short sStack_126;
  ushort local_98;
  ushort uStack_96;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  size_t len;
  longlong extraout_RDX;
  short sVar45;
  short sVar56;
  short sVar57;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar6 = (profile->profile16).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_stats_striped_profile_sse41_128_16_cold_1();
        }
        else {
          uVar21 = uVar4 - 1;
          uVar43 = (ulong)uVar4 + 7 >> 3;
          uVar48 = (ulong)uVar21 % uVar43;
          iVar22 = (int)(uVar21 / uVar43);
          pvVar8 = (profile->profile16).matches;
          pvVar9 = (profile->profile16).similar;
          uVar35 = -open;
          uVar5 = ppVar7->min;
          iVar25 = -uVar5;
          if (uVar5 != uVar35 && SBORROW4(uVar5,uVar35) == (int)(uVar5 + open) < 0) {
            iVar25 = open;
          }
          iVar41 = ppVar7->max;
          ppVar27 = parasail_result_new_stats();
          if (ppVar27 != (parasail_result_t *)0x0) {
            ppVar27->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar27->flag | 0x8210802;
            ptr = parasail_memalign___m128i(0x10,uVar43);
            palVar28 = parasail_memalign___m128i(0x10,uVar43);
            b = parasail_memalign___m128i(0x10,uVar43);
            palVar29 = parasail_memalign___m128i(0x10,uVar43);
            b_00 = parasail_memalign___m128i(0x10,uVar43);
            palVar30 = parasail_memalign___m128i(0x10,uVar43);
            b_01 = parasail_memalign___m128i(0x10,uVar43);
            palVar31 = parasail_memalign___m128i(0x10,uVar43);
            ptr_00 = parasail_memalign___m128i(0x10,uVar43);
            b_02 = parasail_memalign___m128i(0x10,uVar43);
            b_03 = parasail_memalign___m128i(0x10,uVar43);
            b_04 = parasail_memalign___m128i(0x10,uVar43);
            ptr_01 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            auVar91 = (undefined1  [16])0x0;
            c[1]._1_7_ = (undefined7)((ulong)palVar29 >> 8);
            c[1]._0_1_ = b_03 == (__m128i *)0x0;
            auVar49._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
            auVar49._8_8_ = -(ulong)(palVar28 == (__m128i *)0x0);
            auVar73._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar73._8_8_ = -(ulong)(palVar29 == (__m128i *)0x0);
            auVar49 = packssdw(auVar49,auVar73);
            auVar50._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar50._8_8_ = -(ulong)(palVar30 == (__m128i *)0x0);
            auVar92._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
            auVar92._8_8_ = -(ulong)(palVar31 == (__m128i *)0x0);
            auVar73 = packssdw(auVar50,auVar92);
            auVar49 = packssdw(auVar49,auVar73);
            if (((((b_02 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) && b_03 != (__m128i *)0x0)
                 && b_04 != (__m128i *)0x0) && ptr_01 != (int16_t *)0x0) &&
                ((((((((((((((((auVar49 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                              (auVar49 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar49 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar49 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar49 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar49 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar49 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar49 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar49 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar49 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar49 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar49 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar49 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar49[0xf])) {
              iVar23 = s2Len + -1;
              uVar33 = 7 - iVar22;
              len = (size_t)uVar33;
              auVar49 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar46 = auVar49._0_4_;
              auVar49 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar47 = auVar49._0_4_;
              uVar24 = iVar25 - 0x7fff;
              auVar49 = pshuflw(ZEXT416(uVar24),ZEXT416(uVar24),0);
              local_138 = auVar49._0_2_;
              sStack_136 = auVar49._2_2_;
              auVar73 = ZEXT416(CONCAT22((short)(uVar5 >> 0x10),0x7ffe - (short)iVar41));
              auVar73 = pshuflw(auVar73,auVar73,0);
              auVar50 = pshuflw(ZEXT416(uVar33),ZEXT416(uVar33),0);
              local_128 = auVar50._0_2_;
              sStack_126 = auVar50._2_2_;
              c[0] = uVar43;
              parasail_memset___m128i(b,c,len);
              c_00[1] = extraout_RDX;
              c_00[0] = uVar43;
              parasail_memset___m128i(b_00,c_00,len);
              c_01[1] = extraout_RDX_00;
              c_01[0] = uVar43;
              parasail_memset___m128i(b_01,c_01,len);
              c_02[1] = extraout_RDX_01;
              c_02[0] = uVar43;
              parasail_memset___m128i(b_02,c_02,len);
              c_03[1] = extraout_RDX_02;
              c_03[0] = uVar43;
              parasail_memset___m128i(b_03,c_03,len);
              c_04[1] = extraout_RDX_03;
              c_04[0] = uVar43;
              parasail_memset___m128i(b_04,c_04,len);
              lVar36 = (long)(int)uVar35;
              uVar39 = 0;
              do {
                lVar42 = 0;
                lVar40 = lVar36;
                do {
                  lVar38 = lVar40;
                  if (s1_beg != 0) {
                    lVar38 = 0;
                  }
                  uVar37 = 0x8000;
                  if (-0x8000 < lVar38) {
                    uVar37 = (undefined2)lVar38;
                  }
                  *(undefined2 *)((long)&local_48 + lVar42 * 2) = uVar37;
                  lVar38 = lVar38 - (ulong)(uint)open;
                  if (lVar38 < -0x7fff) {
                    lVar38 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar42 * 2) = (short)lVar38;
                  lVar42 = lVar42 + 1;
                  lVar40 = lVar40 - uVar43 * (uint)gap;
                } while (lVar42 != 8);
                ptr[uVar39][0] = local_48;
                ptr[uVar39][1] = lStack_40;
                ptr_00[uVar39][0] = local_58;
                ptr_00[uVar39][1] = lStack_50;
                uVar39 = uVar39 + 1;
                lVar36 = lVar36 - (ulong)(uint)gap;
              } while (uVar39 != uVar43);
              *ptr_01 = 0;
              auVar50 = _DAT_00906ca0;
              lVar36 = (ulong)(uint)s2Len - 1;
              auVar51._8_4_ = (int)lVar36;
              auVar51._0_8_ = lVar36;
              auVar51._12_4_ = (int)((ulong)lVar36 >> 0x20);
              auVar93._4_4_ = gap;
              auVar93._0_4_ = gap;
              auVar93._8_4_ = gap;
              auVar93._12_4_ = gap;
              iVar25 = -gap;
              auVar92 = pmovsxbq(auVar91,0x504);
              auVar91 = pmovsxbq(in_XMM5,0x302);
              auVar108 = pmovsxbq(in_XMM6,0x100);
              auVar51 = auVar51 ^ _DAT_00906ca0;
              auVar65._8_4_ = 0xffffffff;
              auVar65._0_8_ = 0xffffffffffffffff;
              auVar65._12_4_ = 0xffffffff;
              auVar109 = pmovsxbd(in_XMM9,0x7060504);
              auVar112 = pmovsxwd(in_XMM10,0x8000800080008000);
              iVar41 = 0;
              uVar39 = 0;
              do {
                uVar114 = (undefined4)uVar39;
                auVar115._8_4_ = uVar114;
                auVar115._0_8_ = uVar39;
                auVar115._12_4_ = (int)(uVar39 >> 0x20);
                auVar124 = (auVar115 | auVar108) ^ auVar50;
                lVar36 = auVar51._0_8_;
                auVar125._0_8_ = -(ulong)(lVar36 < auVar124._0_8_);
                lVar40 = auVar51._8_8_;
                auVar125._8_8_ = -(ulong)(lVar40 < auVar124._8_8_);
                auVar124 = pshuflw(in_XMM15,auVar125,0xe8);
                in_XMM15 = packssdw(auVar124 ^ auVar65,auVar124 ^ auVar65);
                iVar121 = gap * 2 + iVar41;
                iVar122 = gap * 3 + iVar41;
                auVar124._4_4_ = open;
                auVar124._0_4_ = iVar41;
                auVar124._12_4_ = iVar122;
                auVar124._8_4_ = iVar121;
                iVar117 = uVar35 - iVar41;
                iVar120 = iVar25 - open;
                iVar121 = uVar35 - iVar121;
                iVar122 = uVar35 - iVar122;
                iVar10 = auVar112._0_4_;
                iVar11 = auVar112._4_4_;
                iVar12 = auVar112._8_4_;
                iVar13 = auVar112._12_4_;
                uVar44 = 0;
                if ((in_XMM15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  uVar79 = (ushort)(iVar117 < iVar10) * auVar112._0_2_ |
                           (ushort)(iVar117 >= iVar10) * (short)iVar117;
                  if (s2_beg != 0) {
                    uVar79 = uVar44;
                  }
                  ptr_01[uVar39 + 1] = uVar79;
                }
                auVar125 = packssdw(auVar125,auVar125);
                auVar125 = packssdw(auVar125 ^ auVar65,auVar125 ^ auVar65);
                if ((auVar125 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  uVar79 = (ushort)(iVar120 < iVar11) * auVar112._4_2_ |
                           (ushort)(iVar120 >= iVar11) * (short)iVar120;
                  if (s2_beg != 0) {
                    uVar79 = uVar44;
                  }
                  ptr_01[uVar39 + 2] = uVar79;
                }
                auVar125 = (auVar115 | auVar91) ^ auVar50;
                auVar135._0_8_ = -(ulong)(lVar36 < auVar125._0_8_);
                auVar135._8_8_ = -(ulong)(lVar40 < auVar125._8_8_);
                auVar124 = packssdw(auVar124,auVar135);
                auVar124 = packssdw(auVar124 ^ auVar65,auVar124 ^ auVar65);
                if ((auVar124 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  uVar79 = (ushort)(iVar121 < iVar12) * auVar112._8_2_ |
                           (ushort)(iVar121 >= iVar12) * (short)iVar121;
                  if (s2_beg != 0) {
                    uVar79 = uVar44;
                  }
                  ptr_01[uVar39 + 3] = uVar79;
                }
                auVar124 = pshufhw(auVar124,auVar135,0x84);
                auVar124 = packssdw(auVar124 ^ auVar65,auVar124 ^ auVar65);
                if ((auVar124 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  uVar79 = (ushort)(iVar122 < iVar13) * auVar112._12_2_ |
                           (ushort)(iVar122 >= iVar13) * (short)iVar122;
                  if (s2_beg != 0) {
                    uVar79 = uVar44;
                  }
                  ptr_01[uVar39 + 4] = uVar79;
                }
                auVar80._4_4_ = uVar114;
                auVar80._0_4_ = uVar114;
                auVar80._8_4_ = uVar114;
                auVar80._12_4_ = uVar114;
                auVar124 = pmulld(auVar80 | auVar109,auVar93);
                iVar122 = uVar35 - auVar124._0_4_;
                iVar121 = uVar35 - auVar124._4_4_;
                iVar117 = uVar35 - auVar124._8_4_;
                iVar120 = uVar35 - auVar124._12_4_;
                auVar125 = (auVar115 | auVar92) ^ auVar50;
                auVar118._0_8_ = -(ulong)(lVar36 < auVar125._0_8_);
                auVar118._8_8_ = -(ulong)(lVar40 < auVar125._8_8_);
                auVar124 = pshuflw(auVar124,auVar118,0xe8);
                auVar124 = packssdw(auVar124 ^ auVar65,auVar124 ^ auVar65);
                if ((auVar124 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  uVar79 = (ushort)(iVar122 < iVar10) * auVar112._0_2_ |
                           (ushort)(iVar122 >= iVar10) * (short)iVar122;
                  if (s2_beg != 0) {
                    uVar79 = uVar44;
                  }
                  ptr_01[uVar39 + 5] = uVar79;
                }
                auVar125 = packssdw(auVar118,auVar118);
                auVar124 = packssdw(auVar124,auVar125 ^ auVar65);
                if ((auVar124 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  uVar79 = (ushort)(iVar121 < iVar11) * auVar112._4_2_ |
                           (ushort)(iVar121 >= iVar11) * (short)iVar121;
                  if (s2_beg != 0) {
                    uVar79 = uVar44;
                  }
                  ptr_01[uVar39 + 6] = uVar79;
                }
                auVar115 = (auVar115 | _DAT_00903ac0) ^ auVar50;
                auVar116._0_8_ = -(ulong)(lVar36 < auVar115._0_8_);
                auVar116._8_8_ = -(ulong)(lVar40 < auVar115._8_8_);
                auVar124 = packssdw(auVar124,auVar116);
                auVar124 = packssdw(auVar124 ^ auVar65,auVar124 ^ auVar65);
                if ((auVar124 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  uVar79 = (ushort)(iVar117 < iVar12) * auVar112._8_2_ |
                           (ushort)(iVar117 >= iVar12) * (short)iVar117;
                  if (s2_beg != 0) {
                    uVar79 = uVar44;
                  }
                  ptr_01[uVar39 + 7] = uVar79;
                }
                auVar124 = pshufhw(auVar124,auVar116,0x84);
                auVar124 = packssdw(auVar124 ^ auVar65,auVar124 ^ auVar65);
                if ((auVar124 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  uVar79 = (ushort)(iVar120 < iVar13) * auVar112._12_2_ |
                           (ushort)(iVar120 >= iVar13) * (short)iVar120;
                  if (s2_beg != 0) {
                    uVar79 = uVar44;
                  }
                  ptr_01[uVar39 + 8] = uVar79;
                }
                uVar39 = uVar39 + 8;
                iVar25 = iVar25 + gap * -8;
                iVar41 = iVar41 + gap * 8;
              } while ((s2Len + 7U & 0xfffffff8) != uVar39);
              uVar5 = (uint)uVar43;
              uVar34 = uVar5 - 1;
              uVar39 = 0;
              auVar91._4_2_ = local_138;
              auVar91._0_4_ = auVar49._0_4_;
              auVar91._6_2_ = sStack_136;
              auVar91._8_2_ = local_138;
              auVar91._10_2_ = sStack_136;
              auVar91._12_2_ = local_138;
              auVar91._14_2_ = sStack_136;
              local_98 = auVar73._0_2_;
              uStack_96 = auVar73._2_2_;
              auVar73 = auVar91;
              auVar108 = auVar91;
              auVar109 = auVar91;
              auVar112 = auVar91;
              uVar44 = local_98;
              uVar79 = uStack_96;
              uVar82 = local_98;
              uVar58 = uStack_96;
              uStack_1b0 = local_98;
              uStack_1ae = uStack_96;
              uStack_1ac = local_98;
              uStack_1aa = uStack_96;
              local_23c = iVar23;
              do {
                ptr_05 = b_01;
                ptr_04 = b_00;
                ptr_03 = b;
                ptr_02 = ptr;
                b_01 = palVar31;
                b_00 = palVar30;
                b = palVar29;
                ptr = palVar28;
                _local_1b8 = CONCAT22(uVar79,uVar44);
                _local_1b8 = CONCAT24(uVar82,_local_1b8);
                _local_1b8 = CONCAT26(uVar58,_local_1b8);
                uVar111 = ptr_02[uVar34][0];
                uVar32 = ptr_03[uVar34][0];
                uVar14 = ptr_04[uVar34][0];
                uVar15 = ptr_05[uVar34][0];
                auVar110._0_8_ = uVar32 << 0x10;
                auVar110._8_8_ = ptr_03[uVar34][1] << 0x10 | uVar32 >> 0x30;
                auVar134._0_8_ = uVar14 << 0x10;
                auVar134._8_8_ = ptr_04[uVar34][1] << 0x10 | uVar14 >> 0x30;
                auVar126._0_8_ = uVar15 << 0x10;
                auVar126._8_8_ = ptr_05[uVar34][1] << 0x10 | uVar15 >> 0x30;
                auVar64._8_8_ = ptr_02[uVar34][1] << 0x10 | uVar111 >> 0x30;
                auVar64._0_8_ = uVar111 << 0x10 | (ulong)(ushort)ptr_01[uVar39];
                lVar40 = (long)ppVar7->mapper[(byte)s2[uVar39]] * uVar43 * 0x10;
                local_1c8 = (undefined1  [16])0x0;
                lVar36 = 0;
                auVar116 = pmovsxbw(auVar116,0x101010101010101);
                auVar113 = (undefined1  [16])0x0;
                auVar119._4_2_ = local_138;
                auVar119._0_4_ = auVar49._0_4_;
                auVar119._6_2_ = sStack_136;
                auVar119._8_2_ = local_138;
                auVar119._10_2_ = sStack_136;
                auVar119._12_2_ = local_138;
                auVar119._14_2_ = sStack_136;
                do {
                  pauVar1 = (undefined1 (*) [16])((long)*ptr_00 + lVar36);
                  sVar89 = *(short *)*pauVar1;
                  sVar45 = *(short *)(*pauVar1 + 2);
                  sVar56 = *(short *)(*pauVar1 + 4);
                  sVar57 = *(short *)(*pauVar1 + 6);
                  sVar59 = *(short *)(*pauVar1 + 8);
                  sVar60 = *(short *)(*pauVar1 + 10);
                  sVar61 = *(short *)(*pauVar1 + 0xc);
                  sVar62 = *(short *)(*pauVar1 + 0xe);
                  auVar93 = *pauVar1;
                  auVar50 = *(undefined1 (*) [16])((long)*b_02 + lVar36);
                  auVar92 = *(undefined1 (*) [16])((long)*b_03 + lVar36);
                  auVar51 = *(undefined1 (*) [16])((long)*b_04 + lVar36);
                  auVar65 = paddsw(auVar64,*(undefined1 (*) [16])((long)pvVar6 + lVar36 + lVar40));
                  uVar44 = auVar65._0_2_;
                  uVar79 = (ushort)((short)uVar44 < sVar89) * sVar89 |
                           ((short)uVar44 >= sVar89) * uVar44;
                  uVar58 = auVar65._2_2_;
                  uVar82 = (ushort)((short)uVar58 < sVar45) * sVar45 |
                           ((short)uVar58 >= sVar45) * uVar58;
                  uVar69 = auVar65._4_2_;
                  uVar83 = (ushort)((short)uVar69 < sVar56) * sVar56 |
                           ((short)uVar69 >= sVar56) * uVar69;
                  uVar70 = auVar65._6_2_;
                  uVar84 = (ushort)((short)uVar70 < sVar57) * sVar57 |
                           ((short)uVar70 >= sVar57) * uVar70;
                  uVar71 = auVar65._8_2_;
                  uVar85 = (ushort)((short)uVar71 < sVar59) * sVar59 |
                           ((short)uVar71 >= sVar59) * uVar71;
                  uVar72 = auVar65._10_2_;
                  uVar86 = (ushort)((short)uVar72 < sVar60) * sVar60 |
                           ((short)uVar72 >= sVar60) * uVar72;
                  uVar95 = auVar65._12_2_;
                  uVar98 = auVar65._14_2_;
                  uVar87 = (ushort)((short)uVar95 < sVar61) * sVar61 |
                           ((short)uVar95 >= sVar61) * uVar95;
                  uVar88 = (ushort)((short)uVar98 < sVar62) * sVar62 |
                           ((short)uVar98 >= sVar62) * uVar98;
                  sVar89 = auVar119._0_2_;
                  auVar74._0_2_ =
                       (ushort)((short)uVar79 < sVar89) * sVar89 |
                       ((short)uVar79 >= sVar89) * uVar79;
                  sVar45 = auVar119._2_2_;
                  auVar74._2_2_ =
                       (ushort)((short)uVar82 < sVar45) * sVar45 |
                       ((short)uVar82 >= sVar45) * uVar82;
                  sVar56 = auVar119._4_2_;
                  auVar74._4_2_ =
                       (ushort)((short)uVar83 < sVar56) * sVar56 |
                       ((short)uVar83 >= sVar56) * uVar83;
                  sVar57 = auVar119._6_2_;
                  auVar74._6_2_ =
                       (ushort)((short)uVar84 < sVar57) * sVar57 |
                       ((short)uVar84 >= sVar57) * uVar84;
                  sVar59 = auVar119._8_2_;
                  auVar74._8_2_ =
                       (ushort)((short)uVar85 < sVar59) * sVar59 |
                       ((short)uVar85 >= sVar59) * uVar85;
                  sVar60 = auVar119._10_2_;
                  auVar74._10_2_ =
                       (ushort)((short)uVar86 < sVar60) * sVar60 |
                       ((short)uVar86 >= sVar60) * uVar86;
                  sVar61 = auVar119._12_2_;
                  auVar74._12_2_ =
                       (ushort)((short)uVar87 < sVar61) * sVar61 |
                       ((short)uVar87 >= sVar61) * uVar87;
                  sVar62 = auVar119._14_2_;
                  auVar74._14_2_ =
                       (ushort)((short)uVar88 < sVar62) * sVar62 |
                       ((short)uVar88 >= sVar62) * uVar88;
                  *(undefined1 (*) [16])((long)*ptr + lVar36) = auVar74;
                  auVar81._0_2_ = -(ushort)(sVar89 < (short)uVar79);
                  auVar81._2_2_ = -(ushort)(sVar45 < (short)uVar82);
                  auVar81._4_2_ = -(ushort)(sVar56 < (short)uVar83);
                  auVar81._6_2_ = -(ushort)(sVar57 < (short)uVar84);
                  auVar81._8_2_ = -(ushort)(sVar59 < (short)uVar85);
                  auVar81._10_2_ = -(ushort)(sVar60 < (short)uVar86);
                  auVar81._12_2_ = -(ushort)(sVar61 < (short)uVar87);
                  auVar81._14_2_ = -(ushort)(sVar62 < (short)uVar88);
                  auVar124 = pblendvb(auVar113,auVar50,auVar81);
                  auVar65 = paddsw(auVar110,*(undefined1 (*) [16])((long)pvVar8 + lVar36 + lVar40));
                  auVar66._0_2_ = -(ushort)(uVar44 == auVar74._0_2_);
                  auVar66._2_2_ = -(ushort)(uVar58 == auVar74._2_2_);
                  auVar66._4_2_ = -(ushort)(uVar69 == auVar74._4_2_);
                  auVar66._6_2_ = -(ushort)(uVar70 == auVar74._6_2_);
                  auVar66._8_2_ = -(ushort)(uVar71 == auVar74._8_2_);
                  auVar66._10_2_ = -(ushort)(uVar72 == auVar74._10_2_);
                  auVar66._12_2_ = -(ushort)(uVar95 == auVar74._12_2_);
                  auVar66._14_2_ = -(ushort)(uVar98 == auVar74._14_2_);
                  auVar115 = pblendvb(auVar124,auVar65,auVar66);
                  *(undefined1 (*) [16])((long)*b + lVar36) = auVar115;
                  auVar65 = pblendvb(local_1c8,auVar92,auVar81);
                  auVar124 = paddsw(auVar134,*(undefined1 (*) [16])((long)pvVar9 + lVar36 + lVar40))
                  ;
                  auVar124 = pblendvb(auVar65,auVar124,auVar66);
                  *(undefined1 (*) [16])((long)*b_00 + lVar36) = auVar124;
                  auVar135 = pblendvb(auVar116,auVar51,auVar81);
                  auVar65 = pmovsxbw(auVar81,0x101010101010101);
                  auVar125 = paddsw(auVar126,auVar65);
                  auVar135 = pblendvb(auVar135,auVar125,auVar66);
                  *(undefined1 (*) [16])((long)*b_01 + lVar36) = auVar135;
                  uVar44 = ((short)auVar74._0_2_ < (short)local_1b8) * auVar74._0_2_ |
                           ((short)auVar74._0_2_ >= (short)local_1b8) * local_1b8;
                  uVar79 = ((short)auVar74._2_2_ < (short)uStack_1b6) * auVar74._2_2_ |
                           ((short)auVar74._2_2_ >= (short)uStack_1b6) * uStack_1b6;
                  uVar82 = ((short)auVar74._4_2_ < (short)uStack_1b4) * auVar74._4_2_ |
                           ((short)auVar74._4_2_ >= (short)uStack_1b4) * uStack_1b4;
                  uVar58 = ((short)auVar74._6_2_ < (short)uStack_1b2) * auVar74._6_2_ |
                           ((short)auVar74._6_2_ >= (short)uStack_1b2) * uStack_1b2;
                  uStack_1b0 = ((short)auVar74._8_2_ < (short)uStack_1b0) * auVar74._8_2_ |
                               ((short)auVar74._8_2_ >= (short)uStack_1b0) * uStack_1b0;
                  uStack_1ae = ((short)auVar74._10_2_ < (short)uStack_1ae) * auVar74._10_2_ |
                               ((short)auVar74._10_2_ >= (short)uStack_1ae) * uStack_1ae;
                  uStack_1ac = ((short)auVar74._12_2_ < (short)uStack_1ac) * auVar74._12_2_ |
                               ((short)auVar74._12_2_ >= (short)uStack_1ac) * uStack_1ac;
                  uStack_1aa = ((short)auVar74._14_2_ < (short)uStack_1aa) * auVar74._14_2_ |
                               ((short)auVar74._14_2_ >= (short)uStack_1aa) * uStack_1aa;
                  _local_1b8 = CONCAT22(uVar79,uVar44);
                  _local_1b8 = CONCAT24(uVar82,_local_1b8);
                  _local_1b8 = CONCAT26(uVar58,_local_1b8);
                  sVar89 = auVar109._0_2_;
                  uVar87 = (sVar89 < (short)auVar74._0_2_) * auVar74._0_2_ |
                           (ushort)(sVar89 >= (short)auVar74._0_2_) * sVar89;
                  sVar89 = auVar109._2_2_;
                  uVar95 = (sVar89 < (short)auVar74._2_2_) * auVar74._2_2_ |
                           (ushort)(sVar89 >= (short)auVar74._2_2_) * sVar89;
                  sVar89 = auVar109._4_2_;
                  uVar88 = (sVar89 < (short)auVar74._4_2_) * auVar74._4_2_ |
                           (ushort)(sVar89 >= (short)auVar74._4_2_) * sVar89;
                  sVar89 = auVar109._6_2_;
                  uVar98 = (sVar89 < (short)auVar74._6_2_) * auVar74._6_2_ |
                           (ushort)(sVar89 >= (short)auVar74._6_2_) * sVar89;
                  sVar89 = auVar109._8_2_;
                  uVar100 = (sVar89 < (short)auVar74._8_2_) * auVar74._8_2_ |
                            (ushort)(sVar89 >= (short)auVar74._8_2_) * sVar89;
                  sVar89 = auVar109._10_2_;
                  uVar102 = (sVar89 < (short)auVar74._10_2_) * auVar74._10_2_ |
                            (ushort)(sVar89 >= (short)auVar74._10_2_) * sVar89;
                  sVar89 = auVar109._12_2_;
                  sVar45 = auVar109._14_2_;
                  uVar104 = (sVar89 < (short)auVar74._12_2_) * auVar74._12_2_ |
                            (ushort)(sVar89 >= (short)auVar74._12_2_) * sVar89;
                  uVar106 = (sVar45 < (short)auVar74._14_2_) * auVar74._14_2_ |
                            (ushort)(sVar45 >= (short)auVar74._14_2_) * sVar45;
                  sVar89 = auVar135._0_2_;
                  sVar45 = auVar124._0_2_;
                  uVar83 = (ushort)(sVar45 < sVar89) * sVar89 | (ushort)(sVar45 >= sVar89) * sVar45;
                  sVar89 = auVar135._2_2_;
                  sVar45 = auVar124._2_2_;
                  uVar69 = (ushort)(sVar45 < sVar89) * sVar89 | (ushort)(sVar45 >= sVar89) * sVar45;
                  sVar89 = auVar135._4_2_;
                  sVar45 = auVar124._4_2_;
                  uVar84 = (ushort)(sVar45 < sVar89) * sVar89 | (ushort)(sVar45 >= sVar89) * sVar45;
                  sVar89 = auVar135._6_2_;
                  sVar45 = auVar124._6_2_;
                  uVar70 = (ushort)(sVar45 < sVar89) * sVar89 | (ushort)(sVar45 >= sVar89) * sVar45;
                  sVar89 = auVar135._8_2_;
                  sVar45 = auVar124._8_2_;
                  uVar85 = (ushort)(sVar45 < sVar89) * sVar89 | (ushort)(sVar45 >= sVar89) * sVar45;
                  sVar89 = auVar135._10_2_;
                  sVar45 = auVar124._10_2_;
                  uVar71 = (ushort)(sVar45 < sVar89) * sVar89 | (ushort)(sVar45 >= sVar89) * sVar45;
                  sVar89 = auVar135._12_2_;
                  sVar45 = auVar124._12_2_;
                  sVar56 = auVar124._14_2_;
                  uVar86 = (ushort)(sVar45 < sVar89) * sVar89 | (ushort)(sVar45 >= sVar89) * sVar45;
                  sVar89 = auVar135._14_2_;
                  uVar72 = (ushort)(sVar56 < sVar89) * sVar89 | (ushort)(sVar56 >= sVar89) * sVar56;
                  auVar19._4_4_ = uVar46;
                  auVar19._0_4_ = uVar46;
                  auVar19._8_4_ = uVar46;
                  auVar19._12_4_ = uVar46;
                  auVar65 = psubsw(auVar74,auVar19);
                  auVar17._4_4_ = uVar47;
                  auVar17._0_4_ = uVar47;
                  auVar17._8_4_ = uVar47;
                  auVar17._12_4_ = uVar47;
                  auVar93 = psubsw(auVar93,auVar17);
                  sVar45 = auVar65._0_2_;
                  sVar90 = auVar93._0_2_;
                  auVar52._0_2_ = -(ushort)(sVar90 < sVar45);
                  sVar56 = auVar65._2_2_;
                  sVar96 = auVar93._2_2_;
                  auVar52._2_2_ = -(ushort)(sVar96 < sVar56);
                  sVar57 = auVar65._4_2_;
                  sVar97 = auVar93._4_2_;
                  auVar52._4_2_ = -(ushort)(sVar97 < sVar57);
                  sVar59 = auVar65._6_2_;
                  sVar99 = auVar93._6_2_;
                  auVar52._6_2_ = -(ushort)(sVar99 < sVar59);
                  sVar60 = auVar65._8_2_;
                  sVar101 = auVar93._8_2_;
                  auVar52._8_2_ = -(ushort)(sVar101 < sVar60);
                  sVar61 = auVar65._10_2_;
                  sVar103 = auVar93._10_2_;
                  auVar52._10_2_ = -(ushort)(sVar103 < sVar61);
                  sVar62 = auVar65._12_2_;
                  sVar105 = auVar93._12_2_;
                  sVar63 = auVar65._14_2_;
                  auVar52._12_2_ = -(ushort)(sVar105 < sVar62);
                  sVar107 = auVar93._14_2_;
                  auVar52._14_2_ = -(ushort)(sVar107 < sVar63);
                  auVar50 = pblendvb(auVar50,auVar115,auVar52);
                  auVar92 = pblendvb(auVar92,auVar124,auVar52);
                  auVar93 = pmovsxbw(auVar125,0x101010101010101);
                  auVar51 = paddsw(auVar51,auVar93);
                  auVar65 = paddsw(auVar135,auVar93);
                  auVar51 = pblendvb(auVar51,auVar65,auVar52);
                  auVar93 = psubsw(auVar119,auVar17);
                  sVar123 = auVar93._0_2_;
                  auVar75._0_2_ = -(ushort)(sVar123 < sVar45);
                  sVar127 = auVar93._2_2_;
                  auVar75._2_2_ = -(ushort)(sVar127 < sVar56);
                  sVar128 = auVar93._4_2_;
                  auVar75._4_2_ = -(ushort)(sVar128 < sVar57);
                  sVar129 = auVar93._6_2_;
                  auVar75._6_2_ = -(ushort)(sVar129 < sVar59);
                  sVar130 = auVar93._8_2_;
                  auVar75._8_2_ = -(ushort)(sVar130 < sVar60);
                  sVar131 = auVar93._10_2_;
                  auVar75._10_2_ = -(ushort)(sVar131 < sVar61);
                  sVar132 = auVar93._12_2_;
                  auVar75._12_2_ = -(ushort)(sVar132 < sVar62);
                  sVar133 = auVar93._14_2_;
                  auVar75._14_2_ = -(ushort)(sVar133 < sVar63);
                  auVar113 = pblendvb(auVar113,auVar115,auVar75);
                  sVar89 = auVar115._0_2_;
                  uVar87 = (ushort)((short)uVar87 < sVar89) * sVar89 |
                           ((short)uVar87 >= sVar89) * uVar87;
                  sVar89 = auVar115._2_2_;
                  uVar95 = (ushort)((short)uVar95 < sVar89) * sVar89 |
                           ((short)uVar95 >= sVar89) * uVar95;
                  sVar89 = auVar115._4_2_;
                  uVar88 = (ushort)((short)uVar88 < sVar89) * sVar89 |
                           ((short)uVar88 >= sVar89) * uVar88;
                  sVar89 = auVar115._6_2_;
                  uVar98 = (ushort)((short)uVar98 < sVar89) * sVar89 |
                           ((short)uVar98 >= sVar89) * uVar98;
                  sVar89 = auVar115._8_2_;
                  uVar100 = (ushort)((short)uVar100 < sVar89) * sVar89 |
                            ((short)uVar100 >= sVar89) * uVar100;
                  sVar89 = auVar115._10_2_;
                  uVar102 = (ushort)((short)uVar102 < sVar89) * sVar89 |
                            ((short)uVar102 >= sVar89) * uVar102;
                  sVar89 = auVar115._12_2_;
                  uVar104 = (ushort)((short)uVar104 < sVar89) * sVar89 |
                            ((short)uVar104 >= sVar89) * uVar104;
                  sVar89 = auVar115._14_2_;
                  uVar106 = (ushort)((short)uVar106 < sVar89) * sVar89 |
                            ((short)uVar106 >= sVar89) * uVar106;
                  auVar109._0_2_ =
                       ((short)uVar83 < (short)uVar87) * uVar87 |
                       ((short)uVar83 >= (short)uVar87) * uVar83;
                  auVar109._2_2_ =
                       ((short)uVar69 < (short)uVar95) * uVar95 |
                       ((short)uVar69 >= (short)uVar95) * uVar69;
                  auVar109._4_2_ =
                       ((short)uVar84 < (short)uVar88) * uVar88 |
                       ((short)uVar84 >= (short)uVar88) * uVar84;
                  auVar109._6_2_ =
                       ((short)uVar70 < (short)uVar98) * uVar98 |
                       ((short)uVar70 >= (short)uVar98) * uVar70;
                  auVar109._8_2_ =
                       ((short)uVar85 < (short)uVar100) * uVar100 |
                       ((short)uVar85 >= (short)uVar100) * uVar85;
                  auVar109._10_2_ =
                       ((short)uVar71 < (short)uVar102) * uVar102 |
                       ((short)uVar71 >= (short)uVar102) * uVar71;
                  auVar109._12_2_ =
                       ((short)uVar86 < (short)uVar104) * uVar104 |
                       ((short)uVar86 >= (short)uVar104) * uVar86;
                  auVar109._14_2_ =
                       ((short)uVar72 < (short)uVar106) * uVar106 |
                       ((short)uVar72 >= (short)uVar106) * uVar72;
                  puVar2 = (ushort *)((long)*ptr_00 + lVar36);
                  *puVar2 = (ushort)(sVar45 < sVar90) * sVar90 | (ushort)(sVar45 >= sVar90) * sVar45
                  ;
                  puVar2[1] = (ushort)(sVar56 < sVar96) * sVar96 |
                              (ushort)(sVar56 >= sVar96) * sVar56;
                  puVar2[2] = (ushort)(sVar57 < sVar97) * sVar97 |
                              (ushort)(sVar57 >= sVar97) * sVar57;
                  puVar2[3] = (ushort)(sVar59 < sVar99) * sVar99 |
                              (ushort)(sVar59 >= sVar99) * sVar59;
                  puVar2[4] = (ushort)(sVar60 < sVar101) * sVar101 |
                              (ushort)(sVar60 >= sVar101) * sVar60;
                  puVar2[5] = (ushort)(sVar61 < sVar103) * sVar103 |
                              (ushort)(sVar61 >= sVar103) * sVar61;
                  puVar2[6] = (ushort)(sVar62 < sVar105) * sVar105 |
                              (ushort)(sVar62 >= sVar105) * sVar62;
                  puVar2[7] = (ushort)(sVar63 < sVar107) * sVar107 |
                              (ushort)(sVar63 >= sVar107) * sVar63;
                  *(undefined1 (*) [16])((long)*b_02 + lVar36) = auVar50;
                  *(undefined1 (*) [16])((long)*b_03 + lVar36) = auVar92;
                  *(undefined1 (*) [16])((long)*b_04 + lVar36) = auVar51;
                  auVar119._0_2_ =
                       (ushort)(sVar45 < sVar123) * sVar123 | (ushort)(sVar45 >= sVar123) * sVar45;
                  auVar119._2_2_ =
                       (ushort)(sVar56 < sVar127) * sVar127 | (ushort)(sVar56 >= sVar127) * sVar56;
                  auVar119._4_2_ =
                       (ushort)(sVar57 < sVar128) * sVar128 | (ushort)(sVar57 >= sVar128) * sVar57;
                  auVar119._6_2_ =
                       (ushort)(sVar59 < sVar129) * sVar129 | (ushort)(sVar59 >= sVar129) * sVar59;
                  auVar119._8_2_ =
                       (ushort)(sVar60 < sVar130) * sVar130 | (ushort)(sVar60 >= sVar130) * sVar60;
                  auVar119._10_2_ =
                       (ushort)(sVar61 < sVar131) * sVar131 | (ushort)(sVar61 >= sVar131) * sVar61;
                  auVar119._12_2_ =
                       (ushort)(sVar62 < sVar132) * sVar132 | (ushort)(sVar62 >= sVar132) * sVar62;
                  auVar119._14_2_ =
                       (ushort)(sVar63 < sVar133) * sVar133 | (ushort)(sVar63 >= sVar133) * sVar63;
                  local_1c8 = pblendvb(local_1c8,auVar124,auVar75);
                  auVar50 = paddsw(auVar116,_DAT_00904d10);
                  auVar116 = pblendvb(auVar50,auVar65,auVar75);
                  auVar64 = *(undefined1 (*) [16])((long)*ptr_02 + lVar36);
                  auVar110 = *(undefined1 (*) [16])((long)*ptr_03 + lVar36);
                  auVar134 = *(undefined1 (*) [16])((long)*ptr_04 + lVar36);
                  auVar126 = *(undefined1 (*) [16])((long)*ptr_05 + lVar36);
                  lVar36 = lVar36 + 0x10;
                } while (uVar43 << 4 != lVar36);
                iVar25 = 0;
                auVar20._4_4_ = uVar46;
                auVar20._0_4_ = uVar46;
                auVar20._8_4_ = uVar46;
                auVar20._12_4_ = uVar46;
                auVar18._4_4_ = uVar47;
                auVar18._0_4_ = uVar47;
                auVar18._8_4_ = uVar47;
                auVar18._12_4_ = uVar47;
                auVar50 = pmovsxbw(auVar51,0x101010101010101);
                do {
                  uVar111 = ptr_02[uVar34][0];
                  uVar26 = uVar35;
                  if (s2_beg == 0) {
                    uVar26 = ptr_01[uVar39 + 1] - open;
                  }
                  uVar32 = (ulong)uVar26;
                  if ((int)uVar26 < -0x7fff) {
                    uVar32 = 0xffff8000;
                  }
                  auVar76._8_8_ = ptr_02[uVar34][1] << 0x10 | uVar111 >> 0x30;
                  auVar76._0_8_ = uVar111 << 0x10 | (ulong)(ushort)ptr_01[uVar39];
                  uVar111 = auVar119._0_8_;
                  auVar119._8_8_ = auVar119._8_8_ << 0x10 | uVar111 >> 0x30;
                  auVar119._0_8_ = uVar111 << 0x10 | uVar32 & 0xffff;
                  uVar111 = auVar116._0_8_;
                  auVar116._8_8_ = auVar116._8_8_ << 0x10 | uVar111 >> 0x30;
                  auVar116._0_8_ = uVar111 << 0x10 | 1;
                  lVar36 = auVar113._8_8_;
                  uVar111 = auVar113._0_8_;
                  auVar113._0_8_ = uVar111 << 0x10;
                  auVar113._8_8_ = lVar36 << 0x10 | uVar111 >> 0x30;
                  lVar36 = local_1c8._8_8_;
                  uVar111 = local_1c8._0_8_;
                  local_1c8._0_8_ = uVar111 << 0x10;
                  local_1c8._8_8_ = lVar36 << 0x10 | uVar111 >> 0x30;
                  lVar36 = 0;
                  do {
                    auVar92 = paddsw(auVar76,*(undefined1 (*) [16])((long)pvVar6 + lVar36 + lVar40))
                    ;
                    psVar3 = (short *)((long)*ptr + lVar36);
                    sVar63 = *psVar3;
                    sVar90 = psVar3[1];
                    sVar96 = psVar3[2];
                    sVar97 = psVar3[3];
                    sVar99 = psVar3[4];
                    sVar101 = psVar3[5];
                    sVar103 = psVar3[6];
                    sVar105 = psVar3[7];
                    sVar89 = auVar119._0_2_;
                    auVar67._0_2_ =
                         (ushort)(sVar63 < sVar89) * sVar89 | (ushort)(sVar63 >= sVar89) * sVar63;
                    sVar45 = auVar119._2_2_;
                    auVar67._2_2_ =
                         (ushort)(sVar90 < sVar45) * sVar45 | (ushort)(sVar90 >= sVar45) * sVar90;
                    sVar56 = auVar119._4_2_;
                    auVar67._4_2_ =
                         (ushort)(sVar96 < sVar56) * sVar56 | (ushort)(sVar96 >= sVar56) * sVar96;
                    sVar57 = auVar119._6_2_;
                    auVar67._6_2_ =
                         (ushort)(sVar97 < sVar57) * sVar57 | (ushort)(sVar97 >= sVar57) * sVar97;
                    sVar59 = auVar119._8_2_;
                    auVar67._8_2_ =
                         (ushort)(sVar99 < sVar59) * sVar59 | (ushort)(sVar99 >= sVar59) * sVar99;
                    sVar60 = auVar119._10_2_;
                    auVar67._10_2_ =
                         (ushort)(sVar101 < sVar60) * sVar60 | (ushort)(sVar101 >= sVar60) * sVar101
                    ;
                    sVar61 = auVar119._12_2_;
                    auVar67._12_2_ =
                         (ushort)(sVar103 < sVar61) * sVar61 | (ushort)(sVar103 >= sVar61) * sVar103
                    ;
                    sVar62 = auVar119._14_2_;
                    auVar67._14_2_ =
                         (ushort)(sVar105 < sVar62) * sVar62 | (ushort)(sVar105 >= sVar62) * sVar105
                    ;
                    *(undefined1 (*) [16])((long)*ptr + lVar36) = auVar67;
                    auVar77._0_2_ = -(ushort)(auVar92._0_2_ == auVar67._0_2_);
                    auVar77._2_2_ = -(ushort)(auVar92._2_2_ == auVar67._2_2_);
                    auVar77._4_2_ = -(ushort)(auVar92._4_2_ == auVar67._4_2_);
                    auVar77._6_2_ = -(ushort)(auVar92._6_2_ == auVar67._6_2_);
                    auVar77._8_2_ = -(ushort)(auVar92._8_2_ == auVar67._8_2_);
                    auVar77._10_2_ = -(ushort)(auVar92._10_2_ == auVar67._10_2_);
                    auVar77._12_2_ = -(ushort)(auVar92._12_2_ == auVar67._12_2_);
                    auVar77._14_2_ = -(ushort)(auVar92._14_2_ == auVar67._14_2_);
                    auVar53._0_2_ = -(ushort)(sVar89 < sVar63);
                    auVar53._2_2_ = -(ushort)(sVar45 < sVar90);
                    auVar53._4_2_ = -(ushort)(sVar56 < sVar96);
                    auVar53._6_2_ = -(ushort)(sVar57 < sVar97);
                    auVar53._8_2_ = -(ushort)(sVar59 < sVar99);
                    auVar53._10_2_ = -(ushort)(sVar60 < sVar101);
                    auVar53._12_2_ = -(ushort)(sVar61 < sVar103);
                    auVar53._14_2_ = -(ushort)(sVar62 < sVar105);
                    auVar53 = auVar53 | auVar77;
                    auVar51 = pblendvb(auVar113,*(undefined1 (*) [16])((long)*b + lVar36),auVar53);
                    *(undefined1 (*) [16])((long)*b + lVar36) = auVar51;
                    auVar65 = pblendvb(local_1c8,*(undefined1 (*) [16])((long)*b_00 + lVar36),
                                       auVar53);
                    *(undefined1 (*) [16])((long)*b_00 + lVar36) = auVar65;
                    auVar93 = pblendvb(auVar116,*(undefined1 (*) [16])((long)*b_01 + lVar36),auVar53
                                      );
                    *(undefined1 (*) [16])((long)*b_01 + lVar36) = auVar93;
                    uVar44 = ((short)auVar67._0_2_ < (short)uVar44) * auVar67._0_2_ |
                             ((short)auVar67._0_2_ >= (short)uVar44) * uVar44;
                    uVar79 = ((short)auVar67._2_2_ < (short)uVar79) * auVar67._2_2_ |
                             ((short)auVar67._2_2_ >= (short)uVar79) * uVar79;
                    uVar82 = ((short)auVar67._4_2_ < (short)uVar82) * auVar67._4_2_ |
                             ((short)auVar67._4_2_ >= (short)uVar82) * uVar82;
                    uVar58 = ((short)auVar67._6_2_ < (short)uVar58) * auVar67._6_2_ |
                             ((short)auVar67._6_2_ >= (short)uVar58) * uVar58;
                    uStack_1b0 = ((short)auVar67._8_2_ < (short)uStack_1b0) * auVar67._8_2_ |
                                 ((short)auVar67._8_2_ >= (short)uStack_1b0) * uStack_1b0;
                    uStack_1ae = ((short)auVar67._10_2_ < (short)uStack_1ae) * auVar67._10_2_ |
                                 ((short)auVar67._10_2_ >= (short)uStack_1ae) * uStack_1ae;
                    uStack_1ac = ((short)auVar67._12_2_ < (short)uStack_1ac) * auVar67._12_2_ |
                                 ((short)auVar67._12_2_ >= (short)uStack_1ac) * uStack_1ac;
                    uStack_1aa = ((short)auVar67._14_2_ < (short)uStack_1aa) * auVar67._14_2_ |
                                 ((short)auVar67._14_2_ >= (short)uStack_1aa) * uStack_1aa;
                    sVar89 = auVar109._0_2_;
                    uVar83 = (sVar89 < (short)auVar67._0_2_) * auVar67._0_2_ |
                             (ushort)(sVar89 >= (short)auVar67._0_2_) * sVar89;
                    sVar89 = auVar109._2_2_;
                    uVar69 = (sVar89 < (short)auVar67._2_2_) * auVar67._2_2_ |
                             (ushort)(sVar89 >= (short)auVar67._2_2_) * sVar89;
                    sVar89 = auVar109._4_2_;
                    uVar84 = (sVar89 < (short)auVar67._4_2_) * auVar67._4_2_ |
                             (ushort)(sVar89 >= (short)auVar67._4_2_) * sVar89;
                    sVar89 = auVar109._6_2_;
                    uVar70 = (sVar89 < (short)auVar67._6_2_) * auVar67._6_2_ |
                             (ushort)(sVar89 >= (short)auVar67._6_2_) * sVar89;
                    sVar89 = auVar109._8_2_;
                    uVar85 = (sVar89 < (short)auVar67._8_2_) * auVar67._8_2_ |
                             (ushort)(sVar89 >= (short)auVar67._8_2_) * sVar89;
                    sVar89 = auVar109._10_2_;
                    uVar71 = (sVar89 < (short)auVar67._10_2_) * auVar67._10_2_ |
                             (ushort)(sVar89 >= (short)auVar67._10_2_) * sVar89;
                    sVar89 = auVar109._12_2_;
                    sVar45 = auVar109._14_2_;
                    uVar86 = (sVar89 < (short)auVar67._12_2_) * auVar67._12_2_ |
                             (ushort)(sVar89 >= (short)auVar67._12_2_) * sVar89;
                    uVar72 = (sVar45 < (short)auVar67._14_2_) * auVar67._14_2_ |
                             (ushort)(sVar45 >= (short)auVar67._14_2_) * sVar45;
                    sVar89 = auVar51._0_2_;
                    uVar83 = (ushort)((short)uVar83 < sVar89) * sVar89 |
                             ((short)uVar83 >= sVar89) * uVar83;
                    sVar89 = auVar51._2_2_;
                    uVar69 = (ushort)((short)uVar69 < sVar89) * sVar89 |
                             ((short)uVar69 >= sVar89) * uVar69;
                    sVar89 = auVar51._4_2_;
                    uVar84 = (ushort)((short)uVar84 < sVar89) * sVar89 |
                             ((short)uVar84 >= sVar89) * uVar84;
                    sVar89 = auVar51._6_2_;
                    uVar70 = (ushort)((short)uVar70 < sVar89) * sVar89 |
                             ((short)uVar70 >= sVar89) * uVar70;
                    sVar89 = auVar51._8_2_;
                    uVar85 = (ushort)((short)uVar85 < sVar89) * sVar89 |
                             ((short)uVar85 >= sVar89) * uVar85;
                    sVar89 = auVar51._10_2_;
                    uVar71 = (ushort)((short)uVar71 < sVar89) * sVar89 |
                             ((short)uVar71 >= sVar89) * uVar71;
                    sVar89 = auVar51._12_2_;
                    uVar86 = (ushort)((short)uVar86 < sVar89) * sVar89 |
                             ((short)uVar86 >= sVar89) * uVar86;
                    sVar89 = auVar51._14_2_;
                    uVar72 = (ushort)((short)uVar72 < sVar89) * sVar89 |
                             ((short)uVar72 >= sVar89) * uVar72;
                    sVar89 = auVar93._0_2_;
                    sVar45 = auVar65._0_2_;
                    uVar87 = (ushort)(sVar45 < sVar89) * sVar89 |
                             (ushort)(sVar45 >= sVar89) * sVar45;
                    sVar89 = auVar93._2_2_;
                    sVar45 = auVar65._2_2_;
                    uVar95 = (ushort)(sVar45 < sVar89) * sVar89 |
                             (ushort)(sVar45 >= sVar89) * sVar45;
                    sVar89 = auVar93._4_2_;
                    sVar45 = auVar65._4_2_;
                    uVar88 = (ushort)(sVar45 < sVar89) * sVar89 |
                             (ushort)(sVar45 >= sVar89) * sVar45;
                    sVar89 = auVar93._6_2_;
                    sVar45 = auVar65._6_2_;
                    uVar98 = (ushort)(sVar45 < sVar89) * sVar89 |
                             (ushort)(sVar45 >= sVar89) * sVar45;
                    sVar89 = auVar93._8_2_;
                    sVar45 = auVar65._8_2_;
                    uVar100 = (ushort)(sVar45 < sVar89) * sVar89 |
                              (ushort)(sVar45 >= sVar89) * sVar45;
                    sVar89 = auVar93._10_2_;
                    sVar45 = auVar65._10_2_;
                    uVar102 = (ushort)(sVar45 < sVar89) * sVar89 |
                              (ushort)(sVar45 >= sVar89) * sVar45;
                    sVar89 = auVar93._12_2_;
                    sVar45 = auVar65._12_2_;
                    sVar56 = auVar65._14_2_;
                    uVar104 = (ushort)(sVar45 < sVar89) * sVar89 |
                              (ushort)(sVar45 >= sVar89) * sVar45;
                    sVar89 = auVar93._14_2_;
                    uVar106 = (ushort)(sVar56 < sVar89) * sVar89 |
                              (ushort)(sVar56 >= sVar89) * sVar56;
                    auVar109._0_2_ =
                         ((short)uVar87 < (short)uVar83) * uVar83 |
                         ((short)uVar87 >= (short)uVar83) * uVar87;
                    auVar109._2_2_ =
                         ((short)uVar95 < (short)uVar69) * uVar69 |
                         ((short)uVar95 >= (short)uVar69) * uVar95;
                    auVar109._4_2_ =
                         ((short)uVar88 < (short)uVar84) * uVar84 |
                         ((short)uVar88 >= (short)uVar84) * uVar88;
                    auVar109._6_2_ =
                         ((short)uVar98 < (short)uVar70) * uVar70 |
                         ((short)uVar98 >= (short)uVar70) * uVar98;
                    auVar109._8_2_ =
                         ((short)uVar100 < (short)uVar85) * uVar85 |
                         ((short)uVar100 >= (short)uVar85) * uVar100;
                    auVar109._10_2_ =
                         ((short)uVar102 < (short)uVar71) * uVar71 |
                         ((short)uVar102 >= (short)uVar71) * uVar102;
                    auVar109._12_2_ =
                         ((short)uVar104 < (short)uVar86) * uVar86 |
                         ((short)uVar104 >= (short)uVar86) * uVar104;
                    auVar109._14_2_ =
                         ((short)uVar106 < (short)uVar72) * uVar72 |
                         ((short)uVar106 >= (short)uVar72) * uVar106;
                    auVar92 = psubsw(auVar67,auVar20);
                    auVar119 = psubsw(auVar119,auVar18);
                    auVar68._0_2_ = -(ushort)(auVar119._0_2_ < auVar92._0_2_);
                    auVar68._2_2_ = -(ushort)(auVar119._2_2_ < auVar92._2_2_);
                    auVar68._4_2_ = -(ushort)(auVar119._4_2_ < auVar92._4_2_);
                    auVar68._6_2_ = -(ushort)(auVar119._6_2_ < auVar92._6_2_);
                    auVar68._8_2_ = -(ushort)(auVar119._8_2_ < auVar92._8_2_);
                    auVar68._10_2_ = -(ushort)(auVar119._10_2_ < auVar92._10_2_);
                    auVar68._12_2_ = -(ushort)(auVar119._12_2_ < auVar92._12_2_);
                    auVar68._14_2_ = -(ushort)(auVar119._14_2_ < auVar92._14_2_);
                    if ((ushort)((ushort)(SUB161(auVar68 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar68 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar68 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar68 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar68 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar68 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar68 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar68 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar68 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar68 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar68 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar68 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar68 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar68 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)((byte)(auVar68._14_2_ >> 7) & 1) << 0xe |
                                auVar68._14_2_ & 0x8000) == 0xffff) goto LAB_006ad0dd;
                    auVar113 = pblendvb(auVar113,auVar51,auVar68);
                    local_1c8 = pblendvb(local_1c8,auVar65,auVar68);
                    auVar51 = paddsw(auVar116,auVar50);
                    auVar92 = paddsw(auVar93,auVar50);
                    auVar116 = pblendvb(auVar51,auVar92,auVar68);
                    auVar76 = *(undefined1 (*) [16])((long)*ptr_02 + lVar36);
                    lVar36 = lVar36 + 0x10;
                  } while (uVar43 << 4 != lVar36);
                  iVar25 = iVar25 + 1;
                } while (iVar25 != 8);
LAB_006ad0dd:
                palVar28 = ptr + uVar48;
                sVar45 = (short)(*palVar28)[0];
                sVar56 = *(short *)((long)*palVar28 + 2);
                sVar57 = *(short *)((long)*palVar28 + 4);
                sVar59 = *(short *)((long)*palVar28 + 6);
                sVar60 = (short)(*palVar28)[1];
                sVar61 = *(short *)((long)*palVar28 + 10);
                sVar62 = *(short *)((long)*palVar28 + 0xc);
                sVar63 = *(short *)((long)*palVar28 + 0xe);
                local_68 = auVar91._0_2_;
                sStack_66 = auVar91._2_2_;
                sStack_64 = auVar91._4_2_;
                sStack_62 = auVar91._6_2_;
                sStack_60 = auVar91._8_2_;
                sStack_5e = auVar91._10_2_;
                sStack_5c = auVar91._12_2_;
                sStack_5a = auVar91._14_2_;
                auVar54._0_2_ = -(ushort)(local_68 < sVar45);
                auVar54._2_2_ = -(ushort)(sStack_66 < sVar56);
                auVar54._4_2_ = -(ushort)(sStack_64 < sVar57);
                auVar54._6_2_ = -(ushort)(sStack_62 < sVar59);
                auVar54._8_2_ = -(ushort)(sStack_60 < sVar60);
                auVar54._10_2_ = -(ushort)(sStack_5e < sVar61);
                auVar54._12_2_ = -(ushort)(sStack_5c < sVar62);
                auVar54._14_2_ = -(ushort)(sStack_5a < sVar63);
                auVar112 = pblendvb(auVar112,(undefined1  [16])b[uVar48],auVar54);
                auVar108 = pblendvb(auVar108,(undefined1  [16])b_00[uVar48],auVar54);
                auVar73 = pblendvb(auVar73,(undefined1  [16])b_01[uVar48],auVar54);
                sVar89 = auVar73._14_2_;
                auVar91._0_2_ =
                     (ushort)(sVar45 < local_68) * local_68 | (ushort)(sVar45 >= local_68) * sVar45;
                auVar91._2_2_ =
                     (ushort)(sVar56 < sStack_66) * sStack_66 |
                     (ushort)(sVar56 >= sStack_66) * sVar56;
                auVar91._4_2_ =
                     (ushort)(sVar57 < sStack_64) * sStack_64 |
                     (ushort)(sVar57 >= sStack_64) * sVar57;
                auVar91._6_2_ =
                     (ushort)(sVar59 < sStack_62) * sStack_62 |
                     (ushort)(sVar59 >= sStack_62) * sVar59;
                auVar91._8_2_ =
                     (ushort)(sVar60 < sStack_60) * sStack_60 |
                     (ushort)(sVar60 >= sStack_60) * sVar60;
                auVar91._10_2_ =
                     (ushort)(sVar61 < sStack_5e) * sStack_5e |
                     (ushort)(sVar61 >= sStack_5e) * sVar61;
                auVar91._12_2_ =
                     (ushort)(sVar62 < sStack_5c) * sStack_5c |
                     (ushort)(sVar62 >= sStack_5c) * sVar62;
                auVar91._14_2_ =
                     (ushort)(sVar63 < sStack_5a) * sStack_5a |
                     (ushort)(sVar63 >= sStack_5a) * sVar63;
                auVar16._2_2_ = -(ushort)(sStack_126 == 6);
                auVar16._0_2_ = -(ushort)(local_128 == 7);
                auVar16._4_2_ = -(ushort)(local_128 == 5);
                auVar16._6_2_ = -(ushort)(sStack_126 == 4);
                auVar16._8_2_ = -(ushort)(local_128 == 3);
                auVar16._10_2_ = -(ushort)(sStack_126 == 2);
                auVar16._12_2_ = -(ushort)(local_128 == 1);
                auVar16._14_2_ = -(ushort)(sStack_126 == 0);
                auVar54 = auVar54 & auVar16;
                if ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar54 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar54 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar54 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar54 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar54 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar54 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar54 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar54 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar54 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar54 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar54 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar54[0xf] < '\0') {
                  local_23c = (int)uVar39;
                }
                uVar39 = uVar39 + 1;
                palVar28 = ptr_02;
                palVar29 = ptr_03;
                palVar30 = ptr_04;
                palVar31 = ptr_05;
                if (uVar39 == (uint)s2Len) {
                  if (s2_end == 0) {
                    sVar45 = 0;
                    sVar56 = 0;
                    sVar89 = 0;
                  }
                  else {
                    if (iVar22 < 7) {
                      iVar25 = 0;
                      do {
                        lVar36 = auVar91._8_8_;
                        uVar43 = auVar91._0_8_;
                        auVar91._0_8_ = uVar43 << 0x10;
                        auVar91._8_8_ = lVar36 << 0x10 | uVar43 >> 0x30;
                        lVar36 = auVar112._8_8_;
                        uVar43 = auVar112._0_8_;
                        auVar112._0_8_ = uVar43 << 0x10;
                        auVar112._8_8_ = lVar36 << 0x10 | uVar43 >> 0x30;
                        lVar36 = auVar108._8_8_;
                        uVar43 = auVar108._0_8_;
                        auVar108._0_8_ = uVar43 << 0x10;
                        auVar108._8_8_ = lVar36 << 0x10 | uVar43 >> 0x30;
                        auVar78._0_8_ = auVar73._0_8_ << 0x10;
                        auVar78._8_8_ = auVar73._8_8_ << 0x10 | auVar73._0_8_ >> 0x30;
                        sVar89 = auVar73._12_2_;
                        iVar25 = iVar25 + 1;
                        auVar73 = auVar78;
                      } while (iVar25 < (int)uVar33);
                    }
                    uVar24 = (uint)(ushort)(auVar91._8_8_ >> 0x30);
                    sVar45 = (short)(auVar112._8_8_ >> 0x30);
                    sVar56 = (short)(auVar108._8_8_ >> 0x30);
                  }
                  sVar57 = (short)uVar24;
                  uVar35 = uVar21;
                  if ((s1_end != 0) && (((ulong)uVar4 + 7 & 0x7ffffff8) != 0)) {
                    uVar43 = 0;
                    do {
                      uVar34 = ((uint)uVar43 & 7) * uVar5 + ((uint)(uVar43 >> 3) & 0x1fffffff);
                      if ((int)uVar34 < (int)uVar4) {
                        uVar83 = *(ushort *)((long)*ptr + uVar43 * 2);
                        uVar26 = (uint)uVar83;
                        if (((short)(ushort)uVar24 < (short)uVar83) ||
                           (((uVar83 == (ushort)uVar24 && (local_23c == iVar23)) &&
                            (uVar26 = uVar24, (int)uVar34 < (int)uVar35)))) {
                          uVar24 = uVar26;
                          sVar45 = *(short *)((long)*b + uVar43 * 2);
                          sVar56 = *(short *)((long)*b_00 + uVar43 * 2);
                          sVar89 = *(short *)((long)*b_01 + uVar43 * 2);
                          uVar35 = uVar34;
                          local_23c = iVar23;
                        }
                      }
                      sVar57 = (short)uVar24;
                      uVar43 = uVar43 + 1;
                    } while ((uVar5 & 0xfffffff) << 3 != (int)uVar43);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    uVar43 = ptr[uVar48][1];
                    auVar91._8_8_ = b[uVar48][1];
                    uVar39 = b_00[uVar48][1];
                    auVar108._8_8_ = b_01[uVar48][1];
                    if (iVar22 < 7) {
                      iVar25 = 0;
                      auVar112._8_8_ = ptr[uVar48][0];
                      uVar111 = b[uVar48][0];
                      uVar32 = b_00[uVar48][0];
                      uVar48 = b_01[uVar48][0];
                      do {
                        uVar43 = uVar43 << 0x10 | auVar112._8_8_ >> 0x30;
                        auVar91._8_8_ = auVar91._8_8_ << 0x10 | uVar111 >> 0x30;
                        uVar39 = uVar39 << 0x10 | uVar32 >> 0x30;
                        auVar108._8_8_ = auVar108._8_8_ << 0x10 | uVar48 >> 0x30;
                        iVar25 = iVar25 + 1;
                        auVar112._8_8_ = auVar112._8_8_ << 0x10;
                        uVar111 = uVar111 << 0x10;
                        uVar32 = uVar32 << 0x10;
                        uVar48 = uVar48 << 0x10;
                      } while (iVar25 < (int)uVar33);
                    }
                    sVar57 = (short)(uVar43 >> 0x30);
                    sVar45 = (short)(auVar91._8_8_ >> 0x30);
                    sVar56 = (short)(uVar39 >> 0x30);
                    sVar89 = (short)(auVar108._8_8_ >> 0x30);
                    uVar35 = uVar21;
                    local_23c = iVar23;
                  }
                  auVar55._0_2_ = -(ushort)((short)uVar44 < local_138);
                  auVar55._2_2_ = -(ushort)((short)uVar79 < sStack_136);
                  auVar55._4_2_ = -(ushort)((short)uVar82 < local_138);
                  auVar55._6_2_ = -(ushort)((short)uVar58 < sStack_136);
                  auVar55._8_2_ = -(ushort)((short)uStack_1b0 < local_138);
                  auVar55._10_2_ = -(ushort)((short)uStack_1ae < sStack_136);
                  auVar55._12_2_ = -(ushort)((short)uStack_1ac < local_138);
                  auVar55._14_2_ = -(ushort)((short)uStack_1aa < sStack_136);
                  auVar94._0_2_ = -(ushort)((short)local_98 < (short)auVar109._0_2_);
                  auVar94._2_2_ = -(ushort)((short)uStack_96 < (short)auVar109._2_2_);
                  auVar94._4_2_ = -(ushort)((short)local_98 < (short)auVar109._4_2_);
                  auVar94._6_2_ = -(ushort)((short)uStack_96 < (short)auVar109._6_2_);
                  auVar94._8_2_ = -(ushort)((short)local_98 < (short)auVar109._8_2_);
                  auVar94._10_2_ = -(ushort)((short)uStack_96 < (short)auVar109._10_2_);
                  auVar94._12_2_ = -(ushort)((short)local_98 < (short)auVar109._12_2_);
                  auVar94._14_2_ = -(ushort)((short)uStack_96 < (short)auVar109._14_2_);
                  auVar94 = auVar94 | auVar55;
                  if ((((((((((((((((auVar94 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar94 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar94 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar94 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar94 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar94 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar94 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar94 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar94 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar94 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar94 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar94 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar94 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar94[0xf] < '\0') {
                    *(byte *)&ppVar27->flag = (byte)ppVar27->flag | 0x40;
                    sVar57 = 0;
                    sVar45 = 0;
                    sVar56 = 0;
                    sVar89 = 0;
                    local_23c = 0;
                    uVar35 = 0;
                  }
                  ppVar27->score = (int)sVar57;
                  ppVar27->end_query = uVar35;
                  ppVar27->end_ref = local_23c;
                  *(int *)(ppVar27->field_4).extra = (int)sVar45;
                  ((ppVar27->field_4).stats)->similar = (int)sVar56;
                  ((ppVar27->field_4).stats)->length = (int)sVar89;
                  parasail_free(ptr_01);
                  parasail_free(b_04);
                  parasail_free(b_03);
                  parasail_free(b_02);
                  parasail_free(ptr_00);
                  parasail_free(ptr_05);
                  parasail_free(b_01);
                  parasail_free(ptr_04);
                  parasail_free(b_00);
                  parasail_free(ptr_03);
                  parasail_free(b);
                  parasail_free(ptr_02);
                  parasail_free(ptr);
                  return ppVar27;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile16.score;
    vProfileM = (__m128i*)profile->profile16.matches;
    vProfileS = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);
        vHM = _mm_slli_si128(vHM, 2);
        vHS = _mm_slli_si128(vHS, 2);
        vHL = _mm_slli_si128(vHL, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi16(vH, vH_dag);
            case2 = _mm_cmpeq_epi16(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi16(vEL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vFL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 2);
            vF = _mm_slli_si128(vF, 2);
            vFM = _mm_slli_si128(vFM, 2);
            vFS = _mm_slli_si128(vFS, 2);
            vFL = _mm_slli_si128(vFL, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFL = _mm_insert_epi16(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi16(vH, vHp);
                case2 = _mm_cmpeq_epi16(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi16(vFL, vOne),
                        _mm_adds_epi16(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi16(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
        result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
        result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
            vMaxHM = _mm_slli_si128(vMaxHM, 2);
            vMaxHS = _mm_slli_si128(vMaxHS, 2);
            vMaxHL = _mm_slli_si128(vMaxHL, 2);
        }
        end_query = s1Len-1;
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        matches = (int16_t) _mm_extract_epi16(vMaxHM, 7);
        similar = (int16_t) _mm_extract_epi16(vMaxHS, 7);
        length = (int16_t) _mm_extract_epi16(vMaxHL, 7);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvHStore;
        int16_t *m = (int16_t*)pvHMStore;
        int16_t *s = (int16_t*)pvHSStore;
        int16_t *l = (int16_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}